

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O1

void __thiscall
helics::CommsBroker<helics::udp::UdpComms,_helics::CommonCore>::CommsBroker
          (CommsBroker<helics::udp::UdpComms,_helics::CommonCore> *this,bool arg)

{
  CommonCore::CommonCore(&this->super_CommonCore,arg);
  (this->super_CommonCore).super_Core._vptr_Core = (_func_int **)&PTR__CommsBroker_004e8260;
  (this->super_CommonCore).super_BrokerBase._vptr_BrokerBase =
       (_func_int **)&PTR__CommsBroker_004e85f8;
  *(undefined8 *)&(this->super_CommonCore).field_0xd84 = 0;
  *(undefined8 *)
   ((long)&(this->comms)._M_t.
           super___uniq_ptr_impl<helics::udp::UdpComms,_std::default_delete<helics::udp::UdpComms>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::udp::UdpComms_*,_std::default_delete<helics::udp::UdpComms>_>
           .super__Head_base<0UL,_helics::udp::UdpComms_*,_false>._M_head_impl + 1) = 0;
  loadComms(this);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker(bool arg) noexcept: BrokerT(arg)
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}